

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  uint uVar1;
  int iVar2;
  int32_t iVar3;
  ImGuiIO *pIVar4;
  ImGuiIO *pIVar5;
  long lVar6;
  ImDrawData *drawData;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  long *plVar11;
  undefined1 auVar12 [16];
  double dVar13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ImGuiWS imguiWS;
  int height;
  int width;
  uchar *pixels;
  string httpRoot;
  ImGuiWS local_118;
  ImVec2 local_110;
  ImVec4 local_108;
  ImVec2 local_f8;
  ImVec2 local_f0;
  float local_e4;
  ImGuiIO *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  long *local_b8 [2];
  long local_a8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  printf("Usage: %s [port] [http-root]\n",*argv);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"../examples","");
  uVar1 = 5000;
  if ((1 < argc) && (uVar1 = atoi(argv[1]), argc != 2)) {
    __s = argv[2];
    strlen(__s);
    std::__cxx11::string::_M_replace
              ((ulong)&local_68,0,(char *)local_68._M_string_length,(ulong)__s);
  }
  ImGui::DebugCheckVersionAndDataLayout("1.88 WIP",0x37d0,0x418,8,0x10,0x14,2);
  ImGui::CreateContext((ImFontAtlas *)0x0);
  pIVar4 = ImGui::GetIO();
  ImGui::StyleColorsDark((ImGuiStyle *)0x0);
  ImGuiWS::ImGuiWS(&local_118);
  std::operator+(&local_88,&local_68,"/textures-null");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  plVar11 = local_a8;
  local_b8[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"index.html","");
  __l._M_len = 2;
  __l._M_array = &local_d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,(allocator_type *)&local_108);
  ImGuiWS::init(&local_118,(EVP_PKEY_CTX *)(ulong)uVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  lVar9 = -0x40;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pIVar5 = ImGui::GetIO();
  ImFontAtlas::GetTexDataAsAlpha8
            (pIVar5->Fonts,(uchar **)&local_d8,(int *)&local_108,(int *)&local_110,(int *)0x0);
  ImGuiWS::setTexture(&local_118,0,Alpha8,(int32_t)local_108.x,(int32_t)local_110.x,
                      local_d8._M_dataplus._M_p);
  regenerate(&local_118,0);
  local_e0 = pIVar4;
  lVar9 = std::chrono::_V2::system_clock::now();
  lVar6 = -(lVar9 >> 0x3f);
  lVar9 = lVar9 / 1000 + (lVar9 >> 0x3f);
  lVar10 = lVar9 + lVar6 + 0x411a;
  lVar9 = lVar9 + lVar6;
  do {
    iVar2 = main::counter + 1;
    uVar1 = main::counter * -0x69d0369d + 0x97e4b17b;
    main::counter = iVar2;
    if ((uVar1 >> 2 | uVar1 * 0x40000000) < 0xda740d) {
      regenerate(&local_118,iVar2);
    }
    (local_e0->DisplaySize).x = 640.0;
    (local_e0->DisplaySize).y = 480.0;
    local_a8[3] = std::chrono::_V2::system_clock::now();
    local_a8[3] = local_a8[3] / 1000;
    local_e0->DeltaTime = (float)(ulong)(local_a8[3] - lVar9) / 1e+06;
    ImGui::NewFrame();
    local_d8._M_dataplus._M_p = (pointer)0x41a0000041a00000;
    local_108.x = 0.0;
    local_108.y = 0.0;
    ImGui::SetNextWindowPos((ImVec2 *)&local_d8,0,(ImVec2 *)&local_108);
    local_d8._M_dataplus._M_p = (pointer)0x42c8000043c80000;
    ImGui::SetNextWindowSize((ImVec2 *)&local_d8,0);
    ImGui::Begin("Hello, world!",(bool *)0x0,0);
    ImGuiWS::nConnected(&local_118);
    ImGui::Text("Connected clients: %d");
    pIVar4 = ImGui::GetIO();
    local_e4 = pIVar4->Framerate;
    pIVar4 = ImGui::GetIO();
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / local_e4),
                (double)pIVar4->Framerate);
    ImGui::End();
    local_d8._M_dataplus._M_p = (pointer)0x430c000041a00000;
    local_108.x = 0.0;
    local_108.y = 0.0;
    ImGui::SetNextWindowPos((ImVec2 *)&local_d8,0,(ImVec2 *)&local_108);
    local_d8._M_dataplus._M_p = (pointer)0x4348000043d20000;
    ImGui::SetNextWindowSize((ImVec2 *)&local_d8,0);
    ImGui::Begin("Some random images",(bool *)0x0,0);
    ImGui::Text("The images are regenerated on the server every ~5 seconds");
    local_110.x = 128.0;
    local_110.y = 128.0;
    local_f0.x = 0.0;
    local_f0.y = 0.0;
    local_f8.x = 1.0;
    local_f8.y = 1.0;
    local_d8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    local_d8._M_string_length = 0x3f8000003f800000;
    local_108.x = 1.0;
    local_108.y = 1.0;
    local_108.z = 1.0;
    local_108.w = 0.5;
    ImGui::Image((ImTextureID)(ulong)g_texture0Id,&local_110,&local_f0,&local_f8,(ImVec4 *)&local_d8
                 ,&local_108);
    ImGui::SameLine(0.0,-1.0);
    local_110.x = 128.0;
    local_110.y = 128.0;
    local_f0.x = 0.0;
    local_f0.y = 0.0;
    local_f8.x = 1.0;
    local_f8.y = 1.0;
    local_d8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    local_d8._M_string_length = 0x3f8000003f800000;
    local_108.x = 1.0;
    local_108.y = 1.0;
    local_108.z = 1.0;
    local_108.w = 0.5;
    ImGui::Image((ImTextureID)(ulong)g_texture1Id,&local_110,&local_f0,&local_f8,(ImVec4 *)&local_d8
                 ,&local_108);
    ImGui::SameLine(0.0,-1.0);
    local_110.x = 128.0;
    local_110.y = 128.0;
    local_f0.x = 0.0;
    local_f0.y = 0.0;
    local_f8.x = 1.0;
    local_f8.y = 1.0;
    local_d8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    local_d8._M_string_length = 0x3f8000003f800000;
    local_108.x = 1.0;
    local_108.y = 1.0;
    local_108.z = 1.0;
    local_108.w = 0.5;
    ImGui::Image((ImTextureID)(ulong)g_texture2Id,&local_110,&local_f0,&local_f8,(ImVec4 *)&local_d8
                 ,&local_108);
    ImGui::End();
    local_d8._M_dataplus._M_p = (pointer)0x43b4000041a00000;
    local_108.x = 0.0;
    local_108.y = 0.0;
    ImGui::SetNextWindowPos((ImVec2 *)&local_d8,0,(ImVec2 *)&local_108);
    ImGui::ShowAboutWindow((bool *)0x0);
    ImGui::Render();
    drawData = ImGui::GetDrawData();
    ImGuiWS::setDrawData(&local_118,drawData);
    do {
      lVar9 = std::chrono::_V2::system_clock::now();
      while ((ulong)(lVar9 / 1000) < lVar10 - 100U) {
        lVar9 = lVar10 - lVar9 / 1000;
        auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar12._0_8_ = lVar9;
        auVar12._12_4_ = 0x45300000;
        dVar13 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) * 0.9;
        uVar7 = (ulong)dVar13;
        uVar7 = (long)(dVar13 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
        if (0 < (long)uVar7) {
          local_d8._M_dataplus._M_p = (pointer)(uVar7 / 1000000);
          local_d8._M_string_length = (uVar7 % 1000000) * 1000;
          do {
            iVar2 = nanosleep((timespec *)&local_d8,(timespec *)&local_d8);
            if (iVar2 != -1) break;
            piVar8 = __errno_location();
          } while (*piVar8 == 4);
        }
        lVar9 = std::chrono::_V2::system_clock::now();
      }
      iVar3 = ImGuiWS::nConnected(&local_118);
      lVar10 = lVar10 + 0x411a;
      lVar9 = local_a8[3];
    } while (iVar3 == 0);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s [port] [http-root]\n", argv[0]);

    int port = 5000;
    std::string httpRoot = "../examples";

    if (argc > 1) port = atoi(argv[1]);
    if (argc > 2) httpRoot = argv[2];

    // init dear imgui
    IMGUI_CHECKVERSION();
    ImGui::CreateContext();
    ImGuiIO& io = ImGui::GetIO(); (void)io;

    ImGui::StyleColorsDark();

    // setup imgui-ws
    ImGuiWS imguiWS;
    imguiWS.init(port, httpRoot + "/textures-null", { "", "index.html" });

    // prepare font texture
    {
        unsigned char * pixels;
        int width, height;
        ImGui::GetIO().Fonts->GetTexDataAsAlpha8(&pixels, &width, &height);
        imguiWS.setTexture(0, ImGuiWS::Texture::Type::Alpha8, width, height, (const char *) pixels);
    }

    // generate some random textures
    regenerate(imguiWS, 0);

    VSync vsync;

    while (true) {
        // regenerate random textures every ~5 seconds
        {
            static int counter = 0;
            if (++counter % (5*60) == 0) {
                regenerate(imguiWS, counter);
            }
        }

        io.DisplaySize = ImVec2(640, 480);
        io.DeltaTime = vsync.delta_s();

        ImGui::NewFrame();

        ImGui::SetNextWindowPos({ 20, 20 });
        ImGui::SetNextWindowSize({ 400, 100 });
        ImGui::Begin("Hello, world!");
        ImGui::Text("Connected clients: %d", imguiWS.nConnected());
        ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
        ImGui::End();

        ImGui::SetNextWindowPos({ 20, 140 });
        ImGui::SetNextWindowSize({ 420, 200 });
        ImGui::Begin("Some random images");
        ImGui::Text("The images are regenerated on the server every ~5 seconds");
        ImGui::Image((void *)(intptr_t) g_texture0Id, { 128, 128 }, ImVec2(0,0), ImVec2(1,1), ImVec4(1.0f,1.0f,1.0f,1.0f), ImVec4(1.0f,1.0f,1.0f,0.5f));
        ImGui::SameLine();
        ImGui::Image((void *)(intptr_t) g_texture1Id, { 128, 128 }, ImVec2(0,0), ImVec2(1,1), ImVec4(1.0f,1.0f,1.0f,1.0f), ImVec4(1.0f,1.0f,1.0f,0.5f));
        ImGui::SameLine();
        ImGui::Image((void *)(intptr_t) g_texture2Id, { 128, 128 }, ImVec2(0,0), ImVec2(1,1), ImVec4(1.0f,1.0f,1.0f,1.0f), ImVec4(1.0f,1.0f,1.0f,0.5f));
        ImGui::End();

        ImGui::SetNextWindowPos({ 20, 360 });
        ImGui::ShowAboutWindow();

        // generate ImDrawData
        ImGui::Render();

        // store ImDrawData for asynchronous dispatching to WS clients
        imguiWS.setDrawData(ImGui::GetDrawData());

        // if not clients are connected, just sleep to save CPU
        do {
            vsync.wait();
        } while (imguiWS.nConnected() == 0);
    }

    ImGui::DestroyContext();

    return 0;
}